

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O2

void __thiscall
Number_N10DefaultBase10_Test<char>::Number_N10DefaultBase10_Test
          (Number_N10DefaultBase10_Test<char> *this)

{
  anon_unknown.dwarf_d9a9a::Number<char>::Number(&this->super_Number<char>);
  (this->super_Number<char>).super_Test._vptr_Test = (_func_int **)&PTR__Number_001d76a8;
  return;
}

Assistant:

TYPED_TEST (Number, N10DefaultBase10) {
    pstore::dump::number_base::dec ();
    pstore::dump::number_long v (10, 10);
    v.write (this->out_);
    auto const & actual = this->out_.str ();
    auto const & expected = convert<TypeParam> ("10");
    EXPECT_EQ (expected, actual);
}